

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResamplerModel.cpp
# Opt level: O0

void __thiscall
SRCTools::ResamplerModel::CascadeStage::getOutputSamples
          (CascadeStage *this,FloatSample *outBuffer,uint length)

{
  uint uVar1;
  uint local_1c;
  FloatSample *pFStack_18;
  uint length_local;
  FloatSample *outBuffer_local;
  CascadeStage *this_local;
  
  local_1c = length;
  pFStack_18 = outBuffer;
  outBuffer_local = (FloatSample *)this;
  while (local_1c != 0) {
    if (this->size == 0) {
      uVar1 = (*this->resamplerStage->_vptr_ResamplerStage[2])(this->resamplerStage,(ulong)local_1c)
      ;
      this->size = uVar1;
      if (this->size == 0) {
        this->size = 1;
      }
      else if (0x1000 < this->size) {
        this->size = 0x1000;
      }
      (*this->source->_vptr_FloatSampleProvider[2])(this->source,this->buffer,(ulong)this->size);
      this->bufferPtr = this->buffer;
    }
    (*this->resamplerStage->_vptr_ResamplerStage[3])
              (this->resamplerStage,&this->bufferPtr,&this->size,&stack0xffffffffffffffe8,&local_1c)
    ;
  }
  return;
}

Assistant:

void CascadeStage::getOutputSamples(FloatSample *outBuffer, unsigned int length) {
	while (length > 0) {
		if (size == 0) {
			size = resamplerStage.estimateInLength(length);
			if (size < 1) {
				size = 1;
			} else if (MAX_SAMPLES_PER_RUN < size) {
				size = MAX_SAMPLES_PER_RUN;
			}
			source.getOutputSamples(buffer, size);
			bufferPtr = buffer;
		}
		resamplerStage.process(bufferPtr, size, outBuffer, length);
	}
}